

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfKeyCode.cpp
# Opt level: O0

KeyCode * __thiscall Imf_3_4::KeyCode::operator=(KeyCode *this,KeyCode *other)

{
  KeyCode *other_local;
  KeyCode *this_local;
  
  if (this != other) {
    this->_filmMfcCode = other->_filmMfcCode;
    this->_filmType = other->_filmType;
    this->_prefix = other->_prefix;
    this->_count = other->_count;
    this->_perfOffset = other->_perfOffset;
    this->_perfsPerFrame = other->_perfsPerFrame;
    this->_perfsPerCount = other->_perfsPerCount;
  }
  return this;
}

Assistant:

KeyCode&
KeyCode::operator= (const KeyCode& other)
{
    if (this != &other)
    {
        _filmMfcCode   = other._filmMfcCode;
        _filmType      = other._filmType;
        _prefix        = other._prefix;
        _count         = other._count;
        _perfOffset    = other._perfOffset;
        _perfsPerFrame = other._perfsPerFrame;
        _perfsPerCount = other._perfsPerCount;
    }

    return *this;
}